

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  fp x;
  float_specs specs_00;
  int iVar1;
  fixed_handler *this;
  size_t sVar2;
  char *pcVar3;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar4;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  decimal_fp<double> dVar5;
  fp fVar6;
  fp value_00;
  size_t num_digits;
  fixed_handler handler;
  int max_double_digits;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  double in_stack_000001a0;
  uint32_t integral;
  fp one;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int *in_stack_fffffffffffffe38;
  uint64_t in_stack_fffffffffffffe40;
  fixed_handler *this_00;
  char digit_00;
  float in_stack_fffffffffffffe84;
  unsigned_long in_stack_fffffffffffffe90;
  uint value_01;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  buffer<char> *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  detail *in_stack_fffffffffffffef0;
  uint local_108;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar7;
  undefined4 uStack_fc;
  undefined4 uStack_f4;
  int local_e4 [5];
  significand_type local_d0;
  int local_c8;
  decimal_fp<float> local_ac;
  undefined1 local_9b;
  undefined1 local_9a;
  byte local_99;
  buffer<char> *local_98;
  int local_8c;
  undefined8 local_80;
  int local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  undefined1 *local_30;
  int *local_28;
  long local_20;
  fixed_handler *local_18;
  int local_10;
  result local_4;
  
  local_80._4_4_ = (uint)((ulong)in_RSI >> 0x20);
  local_99 = (char)((ulong)in_RSI >> 0x20) == '\x02';
  local_98 = in_RDX;
  local_8c = in_EDI;
  if (0.0 < (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
    if ((local_80._4_4_ >> 0x13 & 1) == 0) {
      specs_00._4_4_ = in_stack_ffffffffffffff00;
      specs_00.precision = in_stack_fffffffffffffefc;
      local_78 = snprintf_float<double>
                           ((double)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,specs_00,
                            in_stack_fffffffffffffee0);
    }
    else if (in_EDI < 0) {
      if ((local_80._4_4_ >> 0x12 & 1) == 0) {
        dVar5 = dragonbox::to_decimal<double>
                          ((double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_d0 = dVar5.significand;
        local_c8 = dVar5.exponent;
        buffer_appender<char>::buffer_appender
                  ((buffer_appender<char> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)in_stack_fffffffffffffe98.container,
                   in_stack_fffffffffffffe90);
        local_78 = local_c8;
      }
      else {
        local_ac = dragonbox::to_decimal<float>(in_stack_fffffffffffffe84);
        value_01 = (uint)(in_stack_fffffffffffffe90 >> 0x20);
        buffer_appender<char>::buffer_appender
                  ((buffer_appender<char> *)
                   CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)in_stack_fffffffffffffe98.container,value_01);
        local_78 = local_ac.exponent;
      }
    }
    else {
      local_e4[0] = 0;
      local_80 = in_RSI;
      fp::fp<double>((fp *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                     (double)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      value_00.f = (ulong)local_108;
      value_00._8_8_ = extraout_RDX;
      normalize<0>(in_stack_fffffffffffffef0,value_00);
      get_cached_power((int)(in_stack_fffffffffffffe40 >> 0x20),in_stack_fffffffffffffe38);
      x.f._4_4_ = in_stack_fffffffffffffe2c;
      x.f._0_4_ = in_stack_fffffffffffffe28;
      x.e = in_stack_fffffffffffffe30;
      x._12_4_ = in_stack_fffffffffffffe34;
      fVar6.f._4_4_ = in_stack_fffffffffffffe1c;
      fVar6.f._0_4_ = in_stack_fffffffffffffe18;
      fVar6._8_7_ = in_stack_fffffffffffffe20;
      fVar6._15_1_ = in_stack_fffffffffffffe27;
      fVar6 = operator*(x,fVar6);
      local_10 = fVar6.e;
      uVar7 = (undefined4)fVar6.f;
      uStack_fc = fVar6.f._4_4_;
      if (0x2ff < local_8c) {
        local_8c = 0x2ff;
      }
      this = (fixed_handler *)buffer<char>::data(local_98);
      this_00 = (fixed_handler *)CONCAT44(uStack_fc,uVar7);
      local_20 = 1;
      local_28 = local_e4;
      local_30 = &stack0xfffffffffffffe58;
      local_18 = this_00;
      fp::fp(&local_40,1L << (-(char)fVar6.e & 0x3fU),local_10);
      local_44 = (uint32_t)((ulong)local_18 >> (-(char)local_40.e & 0x3fU));
      local_50 = (ulong)local_18 & local_40.f - 1;
      iVar1 = count_digits(local_44);
      *local_28 = iVar1;
      local_4 = fixed_handler::on_start
                          (this_00,in_stack_fffffffffffffe40,(uint64_t)in_stack_fffffffffffffe38,
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (local_4 == more) {
        do {
          local_54 = 0;
          local_58 = 0;
          local_68.digit = &local_58;
          local_68.integral = &local_44;
          in_stack_fffffffffffffe30 = *local_28 + -1;
          in_stack_fffffffffffffe34 = 0;
          switch(in_stack_fffffffffffffe30) {
          case 0:
            local_58 = local_44;
            local_44 = 0;
            break;
          case 1:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10);
            break;
          case 2:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100);
            break;
          case 3:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000);
            break;
          case 4:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000);
            break;
          case 5:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000);
            break;
          case 6:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000);
            break;
          case 7:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000000);
            break;
          case 8:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000000);
            break;
          case 9:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000000);
          }
          *local_28 = *local_28 + -1;
          local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
          digit_00 = (char)((uint)uStack_f4 >> 0x18);
          local_4 = fixed_handler::on_digit
                              (this,digit_00,(uint64_t)this_00,in_stack_fffffffffffffe40,
                               (uint64_t)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                               SUB41((uint)in_stack_fffffffffffffe30 >> 0x18,0));
          if (local_4 != more) goto LAB_0025c0b2;
        } while (0 < *local_28);
        do {
          local_54 = 0;
          local_20 = local_20 * 10;
          local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
          local_50 = local_40.f - 1 & local_50 * 10;
          *local_28 = *local_28 + -1;
          local_4 = fixed_handler::on_digit
                              (this,digit_00,(uint64_t)this_00,in_stack_fffffffffffffe40,
                               (uint64_t)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                               SUB41((uint)in_stack_fffffffffffffe30 >> 0x18,0));
        } while (local_4 == more);
      }
LAB_0025c0b2:
      local_54 = local_4;
      if (local_4 == error) {
        local_e4[0] = local_e4[0] + -1;
        fallback_format<double>
                  (in_stack_000001a0,fractional._4_4_,fractional._3_1_,_digit,
                   (int *)divmod_integral.integral);
      }
      else {
        in_stack_fffffffffffffe28 = SUB84(local_98,0);
        in_stack_fffffffffffffe2c = (int)((ulong)local_98 >> 0x20);
        to_unsigned<int>(0);
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      if (((local_99 & 1) == 0) && ((local_80._4_4_ >> 0x14 & 1) == 0)) {
        sVar2 = buffer<char>::size(local_98);
        while( true ) {
          bVar4 = false;
          if (sVar2 != 0) {
            pcVar3 = buffer<char>::operator[]<unsigned_long>(local_98,sVar2 - 1);
            bVar4 = *pcVar3 == '0';
          }
          if (!bVar4) break;
          sVar2 = sVar2 - 1;
          local_e4[0] = local_e4[0] + 1;
        }
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      local_78 = local_e4[0];
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_99)) {
    local_9a = 0x30;
    buffer<char>::push_back
              ((buffer<char> *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_78 = 0;
  }
  else {
    to_unsigned<int>(in_EDI);
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    buffer<char>::data(local_98);
    local_9b = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c,
               (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    local_78 = -local_8c;
  }
  return local_78;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}